

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,State *state)

{
  ostream *poVar1;
  string local_38 [32];
  State *local_18;
  State *state_local;
  ostream *os_local;
  
  local_18 = state;
  state_local = (State *)os;
  poVar1 = std::operator<<(os,"(state_id = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->state_id);
  poVar1 = std::operator<<(poVar1,", weight = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->weight);
  poVar1 = std::operator<<(poVar1,", text = ");
  (*local_18->_vptr_State[2])();
  poVar1 = std::operator<<(poVar1,local_38);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_38);
  return (ostream *)state_local;
}

Assistant:

ostream& operator<<(ostream& os, const State& state) {
	os << "(state_id = " << state.state_id << ", weight = " << state.weight
			<< ", text = " << (&state)->text() << ")";
	return os;
}